

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# trainer.cc
# Opt level: O2

void __thiscall
xLearn::Trainer::show_train_info
          (Trainer *this,real_t tr_loss,real_t te_loss,real_t te_metric,real_t time_cost,
          bool validate,index_t epoch)

{
  undefined1 auVar1 [16];
  ostream *poVar2;
  undefined8 in_XMM4_Qa;
  undefined8 in_XMM4_Qb;
  Modifier green;
  Modifier reset;
  vector<int,_std::allocator<int>_> width_list;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  str_list;
  string local_90;
  Modifier local_6c;
  real_t local_68;
  real_t local_64;
  real_t local_60;
  real_t local_5c;
  undefined1 local_58 [16];
  pointer local_48;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_38;
  
  local_38.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_48 = (pointer)0x0;
  local_58._0_12_ = ZEXT812(0);
  local_58._12_4_ = 0;
  local_68 = te_metric;
  local_64 = te_loss;
  local_60 = time_cost;
  local_5c = tr_loss;
  local_38.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._0_16_ = local_58;
  StringPrintf_abi_cxx11_(&local_90,"%d");
  std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
  emplace_back<std::__cxx11::string>
            ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)&local_38,
             &local_90);
  std::__cxx11::string::~string((string *)&local_90);
  local_90._M_dataplus._M_p._0_4_ = 6;
  std::vector<int,_std::allocator<int>_>::emplace_back<int>
            ((vector<int,_std::allocator<int>_> *)local_58,(int *)&local_90);
  StringPrintf_abi_cxx11_(&local_90,"%.6f",(double)local_5c);
  std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
  emplace_back<std::__cxx11::string>
            ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)&local_38,
             &local_90);
  std::__cxx11::string::~string((string *)&local_90);
  local_90._M_dataplus._M_p._0_4_ = 0x14;
  std::vector<int,_std::allocator<int>_>::emplace_back<int>
            ((vector<int,_std::allocator<int>_> *)local_58,(int *)&local_90);
  if (validate) {
    StringPrintf_abi_cxx11_(&local_90,"%.6f",(double)local_64);
    std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
    emplace_back<std::__cxx11::string>
              ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)&local_38,
               &local_90);
    std::__cxx11::string::~string((string *)&local_90);
    local_90._M_dataplus._M_p._0_4_ = 0x14;
    std::vector<int,_std::allocator<int>_>::emplace_back<int>
              ((vector<int,_std::allocator<int>_> *)local_58,(int *)&local_90);
    if (this->metric_ != (Metric *)0x0) {
      StringPrintf_abi_cxx11_(&local_90,"%.6f",(double)local_68);
      std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
      emplace_back<std::__cxx11::string>
                ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)&local_38,
                 &local_90);
      std::__cxx11::string::~string((string *)&local_90);
      local_90._M_dataplus._M_p._0_4_ = 0x14;
      std::vector<int,_std::allocator<int>_>::emplace_back<int>
                ((vector<int,_std::allocator<int>_> *)local_58,(int *)&local_90);
    }
  }
  StringPrintf_abi_cxx11_(&local_90,"%.2f",(double)local_60);
  std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
  emplace_back<std::__cxx11::string>
            ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)&local_38,
             &local_90);
  std::__cxx11::string::~string((string *)&local_90);
  local_90._M_dataplus._M_p._0_4_ = 0x14;
  std::vector<int,_std::allocator<int>_>::emplace_back<int>
            ((vector<int,_std::allocator<int>_> *)local_58,(int *)&local_90);
  local_6c.code = RESET;
  local_90._M_dataplus._M_p._0_4_ = 0x20;
  poVar2 = Color::operator<<((ostream *)&std::cout,(Modifier *)&local_90);
  poVar2 = std::operator<<(poVar2,"[ ");
  Color::operator<<(poVar2,&local_6c);
  auVar1._8_8_ = in_XMM4_Qb;
  auVar1._0_8_ = in_XMM4_Qa;
  auVar1 = vcvtusi2sd_avx512f(auVar1,epoch);
  *(undefined8 *)(operator_delete__ + *(long *)(std::cout + -0x18)) = 4;
  poVar2 = (ostream *)
           std::ostream::operator<<(&std::cout,(int)((auVar1._0_8_ / (double)this->epoch_) * 100.0))
  ;
  poVar2 = std::operator<<(poVar2,"%");
  poVar2 = Color::operator<<(poVar2,(Modifier *)&local_90);
  poVar2 = std::operator<<(poVar2,"      ]");
  Color::operator<<(poVar2,&local_6c);
  Color::print_row<std::__cxx11::string>(&local_38,(vector<int,_std::allocator<int>_> *)local_58);
  std::_Vector_base<int,_std::allocator<int>_>::~_Vector_base
            ((_Vector_base<int,_std::allocator<int>_> *)local_58);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&local_38);
  return;
}

Assistant:

void Trainer::show_train_info(real_t tr_loss, 
                              real_t te_loss,
                              real_t te_metric,
                              real_t time_cost, 
                              bool validate,
                              index_t epoch) {
  std::vector<std::string> str_list;
  std::vector<int> width_list;
  str_list.push_back(StringPrintf("%d", epoch));
  width_list.push_back(6);
  str_list.push_back(StringPrintf("%.6f", tr_loss));
  width_list.push_back(20);
  if (validate) {
    str_list.push_back(StringPrintf("%.6f", te_loss));
    width_list.push_back(20);
    if (metric_ != nullptr) {
      str_list.push_back(StringPrintf("%.6f", te_metric));
      width_list.push_back(20);
    }
  }
  str_list.push_back(StringPrintf("%.2f", time_cost));
  width_list.push_back(20);
  Color::Modifier green(Color::FG_GREEN);
  Color::Modifier reset(Color::RESET);
  std::cout << green << "[ " << reset;
  std::cout.width(4); 
  std::cout << static_cast<int>(epoch*1.0/epoch_*100) 
            << "%" << green << "      ]"  << reset;
  Color::print_row(str_list, width_list);
}